

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O0

void bsplib::serial<unsigned_long>(A2A *a2a,int pid,unsigned_long x)

{
  ssize_t sVar1;
  int in_R8D;
  undefined1 local_2a [2];
  int n;
  Buffer buf;
  unsigned_long x_local;
  int pid_local;
  A2A *a2a_local;
  
  buf._2_8_ = x;
  sVar1 = UIntSerialize<unsigned_long>::write((int)x,local_2a,x);
  A2A::send(a2a,pid,local_2a,(long)(int)sVar1,in_R8D);
  return;
}

Assistant:

void serial( A2A & a2a, int pid, UInt x ) {
    typedef UIntSerialize< UInt > S;     
    typename S::Buffer buf;
    { const int n = S::write(x, buf );
      a2a.send( pid, buf, n );
    }
}